

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void __thiscall hmac_hash::SHA1::transform(SHA1 *this,uint32_t *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *block_local;
  SHA1 *this_local;
  
  uVar4 = this->m_h[0];
  uVar2 = this->m_h[1];
  uVar5 = this->m_h[2];
  uVar3 = this->m_h[3];
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + *block + 0x5a827999 + (uVar4 << 5 | uVar4 >> 0x1b) +
          this->m_h[4];
  uVar2 = uVar2 << 0x1e | uVar2 >> 2;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + block[1] + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b)
          + uVar3;
  uVar4 = uVar4 << 0x1e | uVar4 >> 2;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + block[2] + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b)
          + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + block[3] + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b)
          + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + block[4] + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b)
          + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + block[5] + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b)
          + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + block[6] + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b)
          + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + block[7] + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b)
          + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + block[8] + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b)
          + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + block[9] + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b)
          + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + block[10] + 0x5a827999 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + block[0xb] + 0x5a827999 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + block[0xc] + 0x5a827999 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + block[0xd] + 0x5a827999 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + block[0xe] + 0x5a827999 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + block[0xf] + 0x5a827999 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[0xd] ^ block[8] ^ block[2] ^ *block) << 1 |
          (block[0xd] ^ block[8] ^ block[2] ^ *block) >> 0x1f;
  *block = uVar6;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[0xe] ^ block[9] ^ block[3] ^ block[1]) << 1 |
          (block[0xe] ^ block[9] ^ block[3] ^ block[1]) >> 0x1f;
  block[1] = uVar6;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar6 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[0xf] ^ block[10] ^ block[4] ^ block[2]) << 1 |
          (block[0xf] ^ block[10] ^ block[4] ^ block[2]) >> 0x1f;
  block[2] = uVar6;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar6 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (*block ^ block[0xb] ^ block[5] ^ block[3]) << 1 |
          (*block ^ block[0xb] ^ block[5] ^ block[3]) >> 0x1f;
  block[3] = uVar6;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar6 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[1] ^ block[0xc] ^ block[6] ^ block[4]) << 1 |
          (block[1] ^ block[0xc] ^ block[6] ^ block[4]) >> 0x1f;
  block[4] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[2] ^ block[0xd] ^ block[7] ^ block[5]) << 1 |
          (block[2] ^ block[0xd] ^ block[7] ^ block[5]) >> 0x1f;
  block[5] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[3] ^ block[0xe] ^ block[8] ^ block[6]) << 1 |
          (block[3] ^ block[0xe] ^ block[8] ^ block[6]) >> 0x1f;
  block[6] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[4] ^ block[0xf] ^ block[9] ^ block[7]) << 1 |
          (block[4] ^ block[0xf] ^ block[9] ^ block[7]) >> 0x1f;
  block[7] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[5] ^ *block ^ block[10] ^ block[8]) << 1 |
          (block[5] ^ *block ^ block[10] ^ block[8]) >> 0x1f;
  block[8] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[6] ^ block[1] ^ block[0xb] ^ block[9]) << 1 |
          (block[6] ^ block[1] ^ block[0xb] ^ block[9]) >> 0x1f;
  block[9] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[7] ^ block[2] ^ block[0xc] ^ block[10]) << 1 |
          (block[7] ^ block[2] ^ block[0xc] ^ block[10]) >> 0x1f;
  block[10] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) << 1 |
          (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) >> 0x1f;
  block[0xb] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) << 1 |
          (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) >> 0x1f;
  block[0xc] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) << 1 |
          (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) >> 0x1f;
  block[0xd] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[0xb] ^ block[6] ^ *block ^ block[0xe]) << 1 |
          (block[0xb] ^ block[6] ^ *block ^ block[0xe]) >> 0x1f;
  block[0xe] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) << 1 |
          (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) >> 0x1f;
  block[0xf] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[0xd] ^ block[8] ^ block[2] ^ *block) << 1 |
          (block[0xd] ^ block[8] ^ block[2] ^ *block) >> 0x1f;
  *block = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[0xe] ^ block[9] ^ block[3] ^ block[1]) << 1 |
          (block[0xe] ^ block[9] ^ block[3] ^ block[1]) >> 0x1f;
  block[1] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[0xf] ^ block[10] ^ block[4] ^ block[2]) << 1 |
          (block[0xf] ^ block[10] ^ block[4] ^ block[2]) >> 0x1f;
  block[2] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (*block ^ block[0xb] ^ block[5] ^ block[3]) << 1 |
          (*block ^ block[0xb] ^ block[5] ^ block[3]) >> 0x1f;
  block[3] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[1] ^ block[0xc] ^ block[6] ^ block[4]) << 1 |
          (block[1] ^ block[0xc] ^ block[6] ^ block[4]) >> 0x1f;
  block[4] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[2] ^ block[0xd] ^ block[7] ^ block[5]) << 1 |
          (block[2] ^ block[0xd] ^ block[7] ^ block[5]) >> 0x1f;
  block[5] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[3] ^ block[0xe] ^ block[8] ^ block[6]) << 1 |
          (block[3] ^ block[0xe] ^ block[8] ^ block[6]) >> 0x1f;
  block[6] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[4] ^ block[0xf] ^ block[9] ^ block[7]) << 1 |
          (block[4] ^ block[0xf] ^ block[9] ^ block[7]) >> 0x1f;
  block[7] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[5] ^ *block ^ block[10] ^ block[8]) << 1 |
          (block[5] ^ *block ^ block[10] ^ block[8]) >> 0x1f;
  block[8] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[6] ^ block[1] ^ block[0xb] ^ block[9]) << 1 |
          (block[6] ^ block[1] ^ block[0xb] ^ block[9]) >> 0x1f;
  block[9] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[7] ^ block[2] ^ block[0xc] ^ block[10]) << 1 |
          (block[7] ^ block[2] ^ block[0xc] ^ block[10]) >> 0x1f;
  block[10] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) << 1 |
          (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) >> 0x1f;
  block[0xb] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) << 1 |
          (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) >> 0x1f;
  block[0xc] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) << 1 |
          (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) >> 0x1f;
  block[0xd] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[0xb] ^ block[6] ^ *block ^ block[0xe]) << 1 |
          (block[0xb] ^ block[6] ^ *block ^ block[0xe]) >> 0x1f;
  block[0xe] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) << 1 |
          (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) >> 0x1f;
  block[0xf] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[0xd] ^ block[8] ^ block[2] ^ *block) << 1 |
          (block[0xd] ^ block[8] ^ block[2] ^ *block) >> 0x1f;
  *block = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[0xe] ^ block[9] ^ block[3] ^ block[1]) << 1 |
          (block[0xe] ^ block[9] ^ block[3] ^ block[1]) >> 0x1f;
  block[1] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[0xf] ^ block[10] ^ block[4] ^ block[2]) << 1 |
          (block[0xf] ^ block[10] ^ block[4] ^ block[2]) >> 0x1f;
  block[2] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (*block ^ block[0xb] ^ block[5] ^ block[3]) << 1 |
          (*block ^ block[0xb] ^ block[5] ^ block[3]) >> 0x1f;
  block[3] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[1] ^ block[0xc] ^ block[6] ^ block[4]) << 1 |
          (block[1] ^ block[0xc] ^ block[6] ^ block[4]) >> 0x1f;
  block[4] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[2] ^ block[0xd] ^ block[7] ^ block[5]) << 1 |
          (block[2] ^ block[0xd] ^ block[7] ^ block[5]) >> 0x1f;
  block[5] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[3] ^ block[0xe] ^ block[8] ^ block[6]) << 1 |
          (block[3] ^ block[0xe] ^ block[8] ^ block[6]) >> 0x1f;
  block[6] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[4] ^ block[0xf] ^ block[9] ^ block[7]) << 1 |
          (block[4] ^ block[0xf] ^ block[9] ^ block[7]) >> 0x1f;
  block[7] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[5] ^ *block ^ block[10] ^ block[8]) << 1 |
          (block[5] ^ *block ^ block[10] ^ block[8]) >> 0x1f;
  block[8] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[6] ^ block[1] ^ block[0xb] ^ block[9]) << 1 |
          (block[6] ^ block[1] ^ block[0xb] ^ block[9]) >> 0x1f;
  block[9] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[7] ^ block[2] ^ block[0xc] ^ block[10]) << 1 |
          (block[7] ^ block[2] ^ block[0xc] ^ block[10]) >> 0x1f;
  block[10] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) << 1 |
          (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) >> 0x1f;
  block[0xb] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) << 1 |
          (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) >> 0x1f;
  block[0xc] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) << 1 |
          (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) >> 0x1f;
  block[0xd] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[0xb] ^ block[6] ^ *block ^ block[0xe]) << 1 |
          (block[0xb] ^ block[6] ^ *block ^ block[0xe]) >> 0x1f;
  block[0xe] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) << 1 |
          (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) >> 0x1f;
  block[0xf] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[0xd] ^ block[8] ^ block[2] ^ *block) << 1 |
          (block[0xd] ^ block[8] ^ block[2] ^ *block) >> 0x1f;
  *block = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[0xe] ^ block[9] ^ block[3] ^ block[1]) << 1 |
          (block[0xe] ^ block[9] ^ block[3] ^ block[1]) >> 0x1f;
  block[1] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[0xf] ^ block[10] ^ block[4] ^ block[2]) << 1 |
          (block[0xf] ^ block[10] ^ block[4] ^ block[2]) >> 0x1f;
  block[2] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (*block ^ block[0xb] ^ block[5] ^ block[3]) << 1 |
          (*block ^ block[0xb] ^ block[5] ^ block[3]) >> 0x1f;
  block[3] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[1] ^ block[0xc] ^ block[6] ^ block[4]) << 1 |
          (block[1] ^ block[0xc] ^ block[6] ^ block[4]) >> 0x1f;
  block[4] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[2] ^ block[0xd] ^ block[7] ^ block[5]) << 1 |
          (block[2] ^ block[0xd] ^ block[7] ^ block[5]) >> 0x1f;
  block[5] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[3] ^ block[0xe] ^ block[8] ^ block[6]) << 1 |
          (block[3] ^ block[0xe] ^ block[8] ^ block[6]) >> 0x1f;
  block[6] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (block[4] ^ block[0xf] ^ block[9] ^ block[7]) << 1 |
          (block[4] ^ block[0xf] ^ block[9] ^ block[7]) >> 0x1f;
  block[7] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (block[5] ^ *block ^ block[10] ^ block[8]) << 1 |
          (block[5] ^ *block ^ block[10] ^ block[8]) >> 0x1f;
  block[8] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (block[6] ^ block[1] ^ block[0xb] ^ block[9]) << 1 |
          (block[6] ^ block[1] ^ block[0xb] ^ block[9]) >> 0x1f;
  block[9] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (block[7] ^ block[2] ^ block[0xc] ^ block[10]) << 1 |
          (block[7] ^ block[2] ^ block[0xc] ^ block[10]) >> 0x1f;
  block[10] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) << 1 |
          (block[8] ^ block[3] ^ block[0xd] ^ block[0xb]) >> 0x1f;
  block[0xb] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar6 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar2 = (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) << 1 |
          (block[9] ^ block[4] ^ block[0xe] ^ block[0xc]) >> 0x1f;
  block[0xc] = uVar2;
  uVar3 = (uVar4 ^ uVar6 ^ uVar5) + uVar2 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar2 = (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) << 1 |
          (block[10] ^ block[5] ^ block[0xf] ^ block[0xd]) >> 0x1f;
  block[0xd] = uVar2;
  uVar5 = (uVar1 ^ uVar4 ^ uVar6) + uVar2 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar2 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = (block[0xb] ^ block[6] ^ *block ^ block[0xe]) << 1 |
          (block[0xb] ^ block[6] ^ *block ^ block[0xe]) >> 0x1f;
  block[0xe] = uVar1;
  uVar6 = (uVar3 ^ uVar2 ^ uVar4) + uVar1 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar6;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar1 = (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) << 1 |
          (block[0xc] ^ block[7] ^ block[1] ^ block[0xf]) >> 0x1f;
  block[0xf] = uVar1;
  this->m_h[0] = (uVar5 ^ uVar3 ^ uVar2) + uVar1 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) +
                 uVar4 + this->m_h[0];
  this->m_h[1] = uVar6 + this->m_h[1];
  this->m_h[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + this->m_h[2];
  this->m_h[3] = uVar3 + this->m_h[3];
  this->m_h[4] = uVar2 + this->m_h[4];
  this->m_transforms = this->m_transforms + 1;
  return;
}

Assistant:

void SHA1::transform(uint32_t *block) {
        uint32_t a = m_h[0];
        uint32_t b = m_h[1];
        uint32_t c = m_h[2];
        uint32_t d = m_h[3];
        uint32_t e = m_h[4];

        // 4 rounds of 20 operations each. Loop unrolled
        SHA1_R0(a,b,c,d,e, 0);
        SHA1_R0(e,a,b,c,d, 1);
        SHA1_R0(d,e,a,b,c, 2);
        SHA1_R0(c,d,e,a,b, 3);
        SHA1_R0(b,c,d,e,a, 4);
        SHA1_R0(a,b,c,d,e, 5);
        SHA1_R0(e,a,b,c,d, 6);
        SHA1_R0(d,e,a,b,c, 7);
        SHA1_R0(c,d,e,a,b, 8);
        SHA1_R0(b,c,d,e,a, 9);
        SHA1_R0(a,b,c,d,e,10);
        SHA1_R0(e,a,b,c,d,11);
        SHA1_R0(d,e,a,b,c,12);
        SHA1_R0(c,d,e,a,b,13);
        SHA1_R0(b,c,d,e,a,14);
        SHA1_R0(a,b,c,d,e,15);
        SHA1_R1(e,a,b,c,d,16);
        SHA1_R1(d,e,a,b,c,17);
        SHA1_R1(c,d,e,a,b,18);
        SHA1_R1(b,c,d,e,a,19);
        SHA1_R2(a,b,c,d,e,20);
        SHA1_R2(e,a,b,c,d,21);
        SHA1_R2(d,e,a,b,c,22);
        SHA1_R2(c,d,e,a,b,23);
        SHA1_R2(b,c,d,e,a,24);
        SHA1_R2(a,b,c,d,e,25);
        SHA1_R2(e,a,b,c,d,26);
        SHA1_R2(d,e,a,b,c,27);
        SHA1_R2(c,d,e,a,b,28);
        SHA1_R2(b,c,d,e,a,29);
        SHA1_R2(a,b,c,d,e,30);
        SHA1_R2(e,a,b,c,d,31);
        SHA1_R2(d,e,a,b,c,32);
        SHA1_R2(c,d,e,a,b,33);
        SHA1_R2(b,c,d,e,a,34);
        SHA1_R2(a,b,c,d,e,35);
        SHA1_R2(e,a,b,c,d,36);
        SHA1_R2(d,e,a,b,c,37);
        SHA1_R2(c,d,e,a,b,38);
        SHA1_R2(b,c,d,e,a,39);
        SHA1_R3(a,b,c,d,e,40);
        SHA1_R3(e,a,b,c,d,41);
        SHA1_R3(d,e,a,b,c,42);
        SHA1_R3(c,d,e,a,b,43);
        SHA1_R3(b,c,d,e,a,44);
        SHA1_R3(a,b,c,d,e,45);
        SHA1_R3(e,a,b,c,d,46);
        SHA1_R3(d,e,a,b,c,47);
        SHA1_R3(c,d,e,a,b,48);
        SHA1_R3(b,c,d,e,a,49);
        SHA1_R3(a,b,c,d,e,50);
        SHA1_R3(e,a,b,c,d,51);
        SHA1_R3(d,e,a,b,c,52);
        SHA1_R3(c,d,e,a,b,53);
        SHA1_R3(b,c,d,e,a,54);
        SHA1_R3(a,b,c,d,e,55);
        SHA1_R3(e,a,b,c,d,56);
        SHA1_R3(d,e,a,b,c,57);
        SHA1_R3(c,d,e,a,b,58);
        SHA1_R3(b,c,d,e,a,59);
        SHA1_R4(a,b,c,d,e,60);
        SHA1_R4(e,a,b,c,d,61);
        SHA1_R4(d,e,a,b,c,62);
        SHA1_R4(c,d,e,a,b,63);
        SHA1_R4(b,c,d,e,a,64);
        SHA1_R4(a,b,c,d,e,65);
        SHA1_R4(e,a,b,c,d,66);
        SHA1_R4(d,e,a,b,c,67);
        SHA1_R4(c,d,e,a,b,68);
        SHA1_R4(b,c,d,e,a,69);
        SHA1_R4(a,b,c,d,e,70);
        SHA1_R4(e,a,b,c,d,71);
        SHA1_R4(d,e,a,b,c,72);
        SHA1_R4(c,d,e,a,b,73);
        SHA1_R4(b,c,d,e,a,74);
        SHA1_R4(a,b,c,d,e,75);
        SHA1_R4(e,a,b,c,d,76);
        SHA1_R4(d,e,a,b,c,77);
        SHA1_R4(c,d,e,a,b,78);
        SHA1_R4(b,c,d,e,a,79);
     
        // Add the working vars back into m_h
        m_h[0] += a;
        m_h[1] += b;
        m_h[2] += c;
        m_h[3] += d;
        m_h[4] += e;
     
        // Count the number of transformations
        m_transforms++;
    }